

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O2

bool __thiscall ObjectIdentifier::ToString(ObjectIdentifier *this,string *out)

{
  byte *in;
  pointer puVar1;
  undefined8 uVar2;
  bool bVar3;
  char *pcVar4;
  size_t cbIn;
  pointer cbIn_00;
  ObjectIdentifier *pOVar5;
  pointer puVar6;
  size_type *local_90;
  string tmp;
  unsigned_long node;
  pointer local_28;
  size_t cbRead;
  
  pOVar5 = this;
  pcVar4 = GetOidString(this);
  if (pcVar4 != (char *)0x0) {
    pOVar5 = (ObjectIdentifier *)out;
    std::__cxx11::string::assign((char *)out);
  }
  local_90 = &tmp._M_string_length;
  tmp._M_dataplus._M_p = (pointer)0x0;
  local_28 = (pointer)0x0;
  tmp.field_2._8_8_ = 0;
  tmp._M_string_length._0_1_ = 0;
  in = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  cbIn = (long)(this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)in;
  if (cbIn == 0) {
LAB_0012b48a:
    bVar3 = false;
    goto LAB_0012b48c;
  }
  if (*in < 0x28) {
    std::__cxx11::string::assign((char *)&local_90);
    std::__cxx11::to_string
              ((string *)&stack0xffffffffffffffb8,
               (uint)*(this->value).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,".",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb8);
    std::__cxx11::string::append((string *)&local_90);
LAB_0012b362:
    std::__cxx11::string::~string((string *)&node);
    pOVar5 = (ObjectIdentifier *)&stack0xffffffffffffffb8;
    std::__cxx11::string::~string((string *)pOVar5);
    local_28 = (pointer)0x1;
    puVar6 = (pointer)0x1;
  }
  else {
    if (*in < 0x50) {
      std::__cxx11::string::assign((char *)&local_90);
      std::__cxx11::to_string
                ((string *)&stack0xffffffffffffffb8,
                 *(this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start - 0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,".",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb8);
      std::__cxx11::string::append((string *)&local_90);
      goto LAB_0012b362;
    }
    bVar3 = DecodeLong(pOVar5,in,cbIn,(unsigned_long *)(tmp.field_2._M_local_buf + 8),
                       (size_t *)&stack0xffffffffffffffd8);
    uVar2 = tmp.field_2._8_8_;
    if ((ulong)tmp.field_2._8_8_ < 0x50 || !bVar3) goto LAB_0012b48a;
    std::__cxx11::string::assign((char *)&local_90);
    std::__cxx11::to_string((string *)&stack0xffffffffffffffb8,uVar2 - 0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,".",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb8);
    std::__cxx11::string::append((string *)&local_90);
    std::__cxx11::string::~string((string *)&node);
    pOVar5 = (ObjectIdentifier *)&stack0xffffffffffffffb8;
    std::__cxx11::string::~string((string *)pOVar5);
    puVar6 = local_28;
  }
  while( true ) {
    puVar1 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    cbIn_00 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish + -(long)puVar1;
    if (cbIn_00 <= puVar6) break;
    bVar3 = DecodeLong(pOVar5,puVar6 + (long)puVar1,(size_t)cbIn_00,
                       (unsigned_long *)(tmp.field_2._M_local_buf + 8),
                       (size_t *)&stack0xffffffffffffffd8);
    if (!bVar3) goto LAB_0012b48a;
    std::__cxx11::to_string((string *)&stack0xffffffffffffffb8,tmp.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,".",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb8);
    std::__cxx11::string::append((string *)&local_90);
    std::__cxx11::string::~string((string *)&node);
    pOVar5 = (ObjectIdentifier *)&stack0xffffffffffffffb8;
    std::__cxx11::string::~string((string *)pOVar5);
    puVar6 = puVar6 + (long)local_28;
  }
  std::__cxx11::string::swap((string *)out);
  bVar3 = true;
LAB_0012b48c:
  std::__cxx11::string::~string((string *)&local_90);
  return bVar3;
}

Assistant:

bool ObjectIdentifier::ToString(std::string & out) const
{
    // If possible, just look it up in our table
    const char* szOid = this->GetOidString();

    if (szOid != nullptr)
	{
		out = szOid;
	}
        
	std::string tmp;
	size_t cbRead = 0;
	size_t pos = 0;
	unsigned long node = 0;

	if (value.size() < 1)
	{
		return false;
	}
		
	if (value[0] < 40)
	{
		tmp = "0";
		tmp += "." + std::to_string(value[0]);
		cbRead = 1;
	}
	else if (value[0] < 80)
	{
		tmp = "1";
		tmp += "." + std::to_string(value[0] - 40);
		cbRead = 1;
	}
	else
	{
		if (!DecodeLong(&value[0], value.size(), node, cbRead) || node < 80)
			return false;

		tmp = "2";
		tmp += "." + std::to_string(node - 80);
	}

	pos = cbRead;

	for (; pos < value.size(); pos += cbRead)
	{
		if (!DecodeLong(&value[pos], value.size(), node, cbRead))
			return false;

		tmp += "." + std::to_string(node);
	}

	out.swap(tmp);
	return true;
}